

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_coefficients_to_spectrum.h
# Opt level: O3

void __thiscall sptk::FilterCoefficientsToSpectrum::Buffer::~Buffer(Buffer *this)

{
  ~Buffer(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Buffer() {
    }